

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

string * __thiscall duckdb::Catalog::GetDefaultTableSchema_abi_cxx11_(Catalog *this)

{
  ulong uVar1;
  long in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x30));
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"main",local_11);
    ::std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

string Catalog::GetDefaultTableSchema() const {
	return !default_table_schema.empty() ? default_table_schema : DEFAULT_SCHEMA;
}